

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O3

void __thiscall ReconnectingHub::connectionCreated(ReconnectingHub *this,Stream *stream)

{
  ostream *poVar1;
  string local_38;
  
  this->connected = true;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Connected to ",0xd);
  Dashel::Stream::getTargetName_abi_cxx11_(&local_38,stream);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void connectionCreated(Stream* stream)
	{
		connected = true;
		cout << endl
			 << "Connected to " << stream->getTargetName() << endl;
	}